

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarIndent
          (Scanner *this,uint BlockIndent,uint BlockExitIndent,bool *IsDone)

{
  uint uVar1;
  iterator pcVar2;
  char *pcVar3;
  char *pcVar4;
  Twine local_40;
  
  uVar1 = this->Column;
  if (uVar1 < BlockIndent) {
    pcVar3 = this->Current;
    do {
      uVar1 = uVar1 + 1;
      pcVar4 = pcVar3;
      if (this->End != pcVar3) {
        pcVar4 = pcVar3 + (*pcVar3 == ' ');
      }
      if (pcVar4 == pcVar3) break;
      this->Current = pcVar4;
      this->Column = uVar1;
      pcVar3 = pcVar4;
    } while (uVar1 != BlockIndent);
  }
  pcVar2 = skip_nb_char(this,this->Current);
  pcVar3 = this->Current;
  if (pcVar2 == pcVar3) {
    return true;
  }
  if (BlockExitIndent < this->Column) {
    if (BlockIndent <= this->Column) {
      return true;
    }
    if ((pcVar3 == this->End) || (*pcVar3 != '#')) {
      Twine::Twine(&local_40,"A text line is less indented than the block scalar");
      setError(this,&local_40,this->Current);
      return false;
    }
  }
  *IsDone = true;
  return true;
}

Assistant:

bool Scanner::scanBlockScalarIndent(unsigned BlockIndent,
                                    unsigned BlockExitIndent, bool &IsDone) {
  // Skip the indentation.
  while (Column < BlockIndent) {
    auto I = skip_s_space(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }

  if (skip_nb_char(Current) == Current)
    return true;

  if (Column <= BlockExitIndent) { // End of the block literal.
    IsDone = true;
    return true;
  }

  if (Column < BlockIndent) {
    if (Current != End && *Current == '#') { // Trailing comment.
      IsDone = true;
      return true;
    }
    setError("A text line is less indented than the block scalar", Current);
    return false;
  }
  return true; // A normal text line.
}